

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_tree_connect(Curl_easy *data)

{
  connectdata *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  size_t byte_count;
  char *p;
  smb_conn *smbc;
  connectdata *conn;
  undefined1 uStack_41c;
  smb_tree_connect msg;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  msg.bytes._1016_8_ = data;
  sVar2 = strlen((pcVar1->host).name);
  sVar3 = strlen((pcVar1->proto).smbc.share);
  if (sVar2 + sVar3 + 10 < 0x401) {
    memset((void *)((long)&conn + 5),0,0x40b);
    conn._5_1_ = 4;
    conn._6_1_ = 0xff;
    _uStack_41c = 0;
    strcpy((char *)&msg.andx.offset,"\\\\");
    strcpy((char *)&msg.flags,(pcVar1->host).name);
    sVar2 = strlen((pcVar1->host).name);
    strcpy((char *)(sVar2 + (long)&msg.flags),"\\");
    pcVar4 = msg.bytes + (sVar2 - 5);
    strcpy(pcVar4,(pcVar1->proto).smbc.share);
    sVar2 = strlen((pcVar1->proto).smbc.share);
    pcVar4 = pcVar4 + sVar2 + 1;
    strcpy(pcVar4,"?????");
    msg.andx._0_2_ = SUB82(pcVar4 + (6 - (long)&msg.andx.offset),0);
    data_local._4_4_ =
         smb_send_message((Curl_easy *)msg.bytes._1016_8_,'u',(void *)((long)&conn + 5),
                          (size_t)(pcVar4 + (6 - (long)&msg.andx.offset) + 0xb));
  }
  else {
    data_local._4_4_ = CURLE_FILESIZE_EXCEEDED;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_send_tree_connect(struct Curl_easy *data)
{
  struct smb_tree_connect msg;
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  char *p = msg.bytes;

  size_t byte_count = strlen(conn->host.name) + strlen(smbc->share);
  byte_count += strlen(SERVICENAME) + 5; /* 2 nulls and 3 backslashes */
  if(byte_count > sizeof(msg.bytes))
    return CURLE_FILESIZE_EXCEEDED;

  memset(&msg, 0, sizeof(msg));
  msg.word_count = SMB_WC_TREE_CONNECT_ANDX;
  msg.andx.command = SMB_COM_NO_ANDX_COMMAND;
  msg.pw_len = 0;
  MSGCAT("\\\\");
  MSGCAT(conn->host.name);
  MSGCAT("\\");
  MSGCATNULL(smbc->share);
  MSGCATNULL(SERVICENAME); /* Match any type of service */
  byte_count = p - msg.bytes;
  msg.byte_count = smb_swap16((unsigned short)byte_count);

  return smb_send_message(data, SMB_COM_TREE_CONNECT_ANDX, &msg,
                          sizeof(msg) - sizeof(msg.bytes) + byte_count);
}